

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_files.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  FILE *__s;
  FILE *__stream;
  int status_code;
  FILE *self;
  state<0U,_(libbrain::bfop)6,_(libbrain::bfop)6,_(libbrain::bfop)5,_(libbrain::bfop)0,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)5,_(libbrain::bfop)0,_(libbrain::bfop)8,_(libbrain::bfop)9>
  file_cat;
  uchar *data;
  FILE *input;
  FILE *in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffdc;
  
  __s = (FILE *)operator_new__(100);
  memset(__s,0,100);
  input = __s;
  __stream = fopen("../../examples/example_files.cpp","r");
  iVar1 = libbrain::
          state<0U,_(libbrain::bfop)6,_(libbrain::bfop)6,_(libbrain::bfop)5,_(libbrain::bfop)0,_(libbrain::bfop)7,_(libbrain::bfop)1,_(libbrain::bfop)4,_(libbrain::bfop)5,_(libbrain::bfop)0,_(libbrain::bfop)8,_(libbrain::bfop)9>
          ::exec((uchar *)__stream,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0,input);
  fclose(__stream);
  if (__s != (FILE *)0x0) {
    operator_delete__(__s);
  }
  return iVar1;
}

Assistant:

int main() {
    auto* data = BRAIN_ALLOC_TAPE(100);

    // the simple cat program. Simply reads until such a time as it gets code -1 (EOF)
    BRAIN_PROGRAM file_cat = BRAIN_COMPILE(,+[-.,+]);

    // This path works for me. It might not for you. Sorry about that.
    FILE* self = fopen("../../examples/example_files.cpp", "r");

    int status_code = file_cat.exec(data, 0, stdout, self);

    fclose(self);

    delete[] data;

    return status_code;
}